

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sspm.cpp
# Opt level: O0

int __thiscall pg::SSPMSolver::compare_test(SSPMSolver *this,int pindex)

{
  bool bVar1;
  bool bVar2;
  undefined1 local_80 [16];
  undefined1 local_70 [16];
  undefined1 local_60 [16];
  undefined1 local_50 [16];
  undefined1 local_40 [16];
  undefined1 local_30 [24];
  int i;
  int pindex_local;
  SSPMSolver *this_local;
  
  if ((*this->tmp_d == -1) && (*this->test_d == -1)) {
    this_local._4_4_ = 0;
  }
  else if (*this->tmp_d == -1) {
    this_local._4_4_ = 1;
  }
  else if (*this->test_d == -1) {
    this_local._4_4_ = -1;
  }
  else {
    local_30._20_4_ = pindex;
    _i = this;
    for (local_30._16_4_ = 0; (int)local_30._16_4_ < this->l; local_30._16_4_ = local_30._16_4_ + 1)
    {
      if (((int)local_30._20_4_ < this->tmp_d[(int)local_30._16_4_]) &&
         ((int)local_30._20_4_ < this->test_d[(int)local_30._16_4_])) {
        return 0;
      }
      if (this->tmp_d[(int)local_30._16_4_] < this->test_d[(int)local_30._16_4_]) {
        bitset::operator[]((bitset *)local_30,(size_t)&this->tmp_b);
        bVar1 = bitset::reference::operator_cast_to_bool((reference *)local_30);
        if (!bVar1) {
          return -1;
        }
        return 1;
      }
      if (this->test_d[(int)local_30._16_4_] < this->tmp_d[(int)local_30._16_4_]) {
        bitset::operator[]((bitset *)local_40,(size_t)&this->test_b);
        bVar1 = bitset::reference::operator_cast_to_bool((reference *)local_40);
        if (!bVar1) {
          return 1;
        }
        return -1;
      }
      bitset::operator[]((bitset *)local_50,(size_t)&this->tmp_b);
      bVar1 = bitset::reference::operator_cast_to_bool((reference *)local_50);
      bitset::operator[]((bitset *)local_60,(size_t)&this->test_b);
      bVar2 = bitset::reference::operator_cast_to_bool((reference *)local_60);
      if (bVar1 < bVar2) {
        return -1;
      }
      bitset::operator[]((bitset *)local_70,(size_t)&this->tmp_b);
      bVar1 = bitset::reference::operator_cast_to_bool((reference *)local_70);
      bitset::operator[]((bitset *)local_80,(size_t)&this->test_b);
      bVar2 = bitset::reference::operator_cast_to_bool((reference *)local_80);
      if (bVar2 < bVar1) {
        return 1;
      }
    }
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int
SSPMSolver::compare_test(int pindex)
{
    // cases involving Top
    if (tmp_d[0] == -1 and test_d[0] == -1) return 0;
    if (tmp_d[0] == -1) return 1;
    if (test_d[0] == -1) return -1;
    for (int i=0; i<l; i++) {
        if (tmp_d[i] > pindex and test_d[i] > pindex) {
            // equal until pindex, return 0
            return 0;
        } else if (tmp_d[i] < test_d[i]) {
            // equal until test has [eps]
            if (tmp_b[i] == 0) return -1;
            else return 1;
        } else if (tmp_d[i] > test_d[i]) {
            // equal until tmp has [eps]
            if (test_b[i] == 0) return 1;
            else return -1;
        } else if (tmp_b[i] < test_b[i]) {
            // equal until tmp<test
            return -1;
        } else if (tmp_b[i] > test_b[i]) {
            // equal until tmp>test
            return 1;
        }
    }
    return 0;
}